

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::loadLP
          (SPxSolverBase<double> *this,SPxLPBase<double> *lp,bool initSlackBasis)

{
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x1b])();
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(this);
  (*(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase[8])(&this->super_SPxBasisBase<double>);
  this->nClckSkipsLeft = 0;
  this->nCallsToTimelim = 0;
  this->theCumulativeTime = 0.0;
  if (this->thepricer != (SPxPricer<double> *)0x0) {
    (*this->thepricer->_vptr_SPxPricer[2])();
  }
  if (this->theratiotester != (SPxRatioTester<double> *)0x0) {
    (*this->theratiotester->_vptr_SPxRatioTester[2])();
  }
  SPxLPBase<double>::operator=(&this->super_SPxLPBase<double>,lp);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x79])(this);
  SPxBasisBase<double>::load(&this->super_SPxBasisBase<double>,this,initSlackBasis);
  return;
}

Assistant:

void SPxSolverBase<R>::loadLP(const SPxLPBase<R>& lp, bool initSlackBasis)
{
   clear();
   unInit();
   this->unLoad();
   resetClockStats();

   if(thepricer)
      thepricer->clear();

   if(theratiotester)
      theratiotester->clear();

   SPxLPBase<R>::operator=(lp);
   reDim();
   SPxBasisBase<R>::load(this, initSlackBasis);
}